

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcondensedcompel.cpp
# Opt level: O2

void __thiscall TPZCondensedCompEl::LoadSolution(TPZCondensedCompEl *this)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  int64_t iVar4;
  TNode *pTVar5;
  undefined1 auVar6 [16];
  int64_t iVar7;
  TPZCompMesh *pTVar8;
  TPZCompMesh *pTVar9;
  TPZFMatrix<double> *this_00;
  long lVar10;
  double *pdVar11;
  TPZConnect *pTVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  pair<long,_long> local_348;
  TPZFMatrix<double> u1;
  TPZFNMatrix<60,_double> elsol;
  
  local_348.second = local_348.first;
  TPZCompEl::LoadSolution(&this->super_TPZCompEl);
  if ((this->fCondensed).super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
      (this->fCondensed).fDim1) {
    uVar2 = (uint)(this->fCondensedConnectIndexes).super_TPZVec<long>.fNElements;
    iVar4 = (this->fActiveConnectIndexes).super_TPZVec<long>.fNElements;
    iVar14 = (int)this->fNumTotalEqs;
    iVar7 = this->fNumInternalEqs;
    pTVar8 = TPZCompEl::Mesh(&this->super_TPZCompEl);
    pTVar9 = TPZCompEl::Mesh(&this->super_TPZCompEl);
    this_00 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(&pTVar9->fSolution);
    elsol.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFMatrix<double>::TPZFMatrix(&u1,(long)(iVar14 - (int)iVar7),1,(double *)&elsol);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_348.second;
    local_348 = (pair<long,_long>)(auVar6 << 0x40);
    TPZFNMatrix<60,_double>::TPZFNMatrix(&elsol,(long)iVar14,1,(double *)&local_348);
    iVar14 = (int)iVar4;
    if (iVar14 < 1) {
      iVar14 = 0;
    }
    lVar17 = 0;
    for (iVar15 = 0; iVar15 != iVar14; iVar15 = iVar15 + 1) {
      lVar10 = (**(code **)(*(long *)&this->super_TPZCompEl + 0xa8))();
      pTVar5 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore;
      uVar3 = pTVar5[*(int *)(lVar10 + 8)].dim;
      uVar16 = (ulong)uVar3;
      if (uVar3 != 0) {
        lVar10 = (long)pTVar5[*(int *)(lVar10 + 8)].pos;
        if ((int)uVar3 < 1) {
          uVar16 = 0;
        }
        while (bVar18 = uVar16 != 0, uVar16 = uVar16 - 1, bVar18) {
          pdVar11 = TPZFMatrix<double>::operator()(this_00,lVar10,0);
          dVar1 = *pdVar11;
          pdVar11 = TPZFMatrix<double>::operator()(&u1,lVar17,0);
          lVar17 = lVar17 + 1;
          *pdVar11 = dVar1;
          lVar10 = lVar10 + 1;
        }
      }
    }
    TPZMatRed<double,_TPZFMatrix<double>_>::UGlobal
              (&this->fCondensed,&u1,&elsol.super_TPZFMatrix<double>);
    uVar16 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar16 = 0;
    }
    lVar17 = 0;
    for (uVar13 = 0; uVar13 != uVar16; uVar13 = uVar13 + 1) {
      iVar4 = (this->fCondensedConnectIndexes).super_TPZVec<long>.fStore[uVar13];
      pTVar9 = TPZCompEl::Mesh(&this->super_TPZCompEl);
      pTVar12 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&(pTVar9->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,iVar4);
      iVar15 = (int)pTVar12->fSequenceNumber;
      iVar14 = (pTVar8->fBlock).fBlock.super_TPZVec<TPZBlock::TNode>.fStore[iVar15].dim;
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      lVar10 = 0;
      while( true ) {
        if (iVar14 == (int)lVar10) break;
        pdVar11 = TPZFMatrix<double>::operator()(&elsol.super_TPZFMatrix<double>,lVar10 + lVar17,0);
        dVar1 = *pdVar11;
        local_348 = TPZBlock::at(&pTVar8->fBlock,iVar15,0,(int)lVar10,0);
        pdVar11 = TPZMatrix<double>::at(&this_00->super_TPZMatrix<double>,&local_348);
        *pdVar11 = dVar1;
        lVar10 = lVar10 + 1;
      }
      lVar17 = lVar10 + lVar17;
    }
    (**(code **)(*(long *)this->fReferenceCompEl + 0xc0))();
    TPZFNMatrix<60,_double>::~TPZFNMatrix(&elsol);
    TPZFMatrix<double>::~TPZFMatrix(&u1);
  }
  return;
}

Assistant:

void TPZCondensedCompEl::LoadSolution()
{
//    if (fKeepMatrix == false) {
//        fKeepMatrix = true;
//        fCondensed.K00()->Redim(fNumInternalEqs, fNumInternalEqs);
//        fCondensed.Redim(fNumTotalEqs, fNumInternalEqs);
//        TPZElementMatrix ek,ef;
//        CalcStiff(ek, ef);
//        fKeepMatrix = false;
//    }
    // initialize the solution of the constrained connects
    TPZCompEl::LoadSolution();
    
    // if the matrix has not been condensed then nothing to do
    if (fCondensed.Rows() != fCondensed.Dim1())
    {
        return;
    }
    // compute the solution of the internal equations
    int dim0=0, dim1=0;
    int nc = fIndexes.size(),nc0 = fCondensedConnectIndexes.size(), nc1 = fActiveConnectIndexes.size();
//    int ic;
//    for (ic=0; ic<nc ; ic++) {
//        int64_t connectindex = fIndexes[ic];
//        TPZConnect &con = fReferenceCompEl->Connect(connectindex);
//        int sz = con.NShape()*con.NState();
//        if (con.IsCondensed()) {
//#ifdef PZDEBUG
//            if (dim1) {
//                DebugStop();
//            }
//#endif
//            dim0 += sz;
//        }
//        else
//        {
//            dim1 += sz;
//        }
//    }
    dim0 = fNumInternalEqs;
    dim1 = fNumTotalEqs-dim0;
    //TPZBlock &bl = Mesh()->Block();
	TPZBlock &bl = Mesh()->Block();
    TPZFMatrix<STATE> &sol = Mesh()->Solution();
    int64_t count = 0;
    //TPZFMatrix<REAL> u1(dim1,1,0.);
	TPZFMatrix<STATE> u1(dim1,1,0.);
    //TPZFMatrix<REAL> elsol(dim0+dim1,1,0.);
	TPZFNMatrix<60,STATE> elsol(dim0+dim1,1,0.);
    for (int ic=0; ic<nc1 ; ic++) {
        TPZConnect &c = Connect(ic);
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        if(blsize)
        {
            int64_t firsteq = bl.Position(seqnum);
            for (int ibl=0; ibl<blsize; ibl++) {
                u1(count++,0) = sol(firsteq+ibl,0);
            }
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        TPZManVector<int64_t,60> u1eq(dim1);
        int64_t count = 0;
        for (int ic=0; ic<nc1 ; ic++) {
            TPZConnect &c = Connect(ic);
            int64_t seqnum = c.SequenceNumber();
            int blsize = bl.Size(seqnum);
            if(blsize)
            {
                int64_t firsteq = bl.Position(seqnum);
                for (int ibl=0; ibl<blsize; ibl++) {
                    u1eq[count++] = firsteq+ibl;
                }
            }
        }
        std::stringstream sout;
        sout << "Computing UGlobal Index " << Index();
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = u1(i,0);
        sout << "u1 " << u1vec << std::endl;
        sout << "u1 eq " << u1eq << std::endl;
        for(int i=0; i<dim1; i++) sout << sol(u1eq[i],0) << ' ';
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fCondensed.UGlobal(u1, elsol);
    count = 0;
    for (int ic=0; ic<nc0 ; ic++) {
        int64_t cindex = fCondensedConnectIndexes[ic];
        TPZConnect &c = Mesh()->ConnectVec()[cindex];
        int64_t seqnum = c.SequenceNumber();
        int blsize = bl.Size(seqnum);
        for (int ibl=0; ibl<blsize; ibl++) {
            sol.at(bl.at(seqnum,0,ibl,0)) = elsol(count++,0);
        }
    }
#ifdef PZ_LOG
    if (logger.isDebugEnabled()) {
        std::stringstream sout;
        sout << "After Computing UGlobal Index " << Index() ;
        sout << " Norm fK01 " << Norm(fCondensed.K01()) << std::endl;
        TPZVec<STATE> u1vec(dim1+dim0);
        for(int i=0; i<u1vec.size(); i++) u1vec[i] = elsol(i,0);
        sout << "elsol " << u1vec;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    fReferenceCompEl->LoadSolution();
//    if (fKeepMatrix == false) {
//        fCondensed.Redim(0,0);
//        fCondensed.K00()->Redim(0, 0);
//    }

}